

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O3

void __thiscall
read_writecase::_impl<picnic_params_t>(read_writecase *this,anon_enum_32 *parameters)

{
  anon_enum_32 *paVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  result_type rVar5;
  size_type sVar6;
  uint uVar7;
  long lVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  context_frame context_frame_1120;
  int sk_written;
  int pk_written;
  size_t signature_len;
  size_t max_signature_size;
  picnic_publickey_t pk2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  array<unsigned_char,_256UL> message;
  picnic_privatekey_t sk;
  picnic_publickey_t pk;
  picnic_privatekey_t sk2;
  value_expr<bool> local_1899;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1898;
  context_frame local_187c;
  assertion_result local_1878;
  value_expr<bool> *local_1860;
  int local_1858;
  int local_1854;
  assertion_result local_1850;
  char *local_1838;
  char *local_1830;
  size_type local_1828;
  size_type local_1820;
  anon_enum_32 *local_1818;
  assertion_result local_1810 [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_17c8;
  assertion_result local_17a8;
  char *local_1790;
  const_string local_16a8;
  const_string local_1698;
  const_string local_1688;
  const_string local_1678;
  const_string local_1668;
  const_string local_1658;
  const_string local_1648;
  const_string local_1638;
  const_string local_1628;
  const_string local_1618;
  const_string local_1608;
  const_string local_15f8;
  const_string local_15e8;
  const_string local_15d8;
  const_string local_15c8;
  const_string local_15b8;
  const_string local_15a8;
  const_string local_1598;
  const_string local_1588;
  const_string local_1578;
  const_string local_1568;
  const_string local_1558;
  const_string local_1548;
  const_string local_1538;
  const_string local_1528;
  const_string local_1518;
  const_string local_1508;
  const_string local_14f8;
  const_string local_14e8;
  const_string local_14d8;
  const_string local_14c8;
  const_string local_14b8;
  const_string local_14a8;
  const_string local_1498;
  const_string local_1488;
  const_string local_1478;
  char *local_1468;
  char *local_1460;
  value_expr<const_unsigned_long_&> local_1400 [9];
  undefined1 local_13b8 [5000];
  
  local_17a8.m_message.px._0_1_ = 0;
  local_17a8._0_8_ = &PTR__lazy_ostream_00183670;
  local_17a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1790 = "Parameter set: ";
  local_1468 = (char *)picnic_get_param_name(*parameters);
  local_13b8._16_8_ = &local_17a8;
  local_13b8[8] = false;
  local_13b8._0_8_ = &PTR__lazy_ostream_00185768;
  local_13b8._24_8_ = (value_expr<bool> *)&local_1468;
  boost::test_tools::tt_detail::context_frame::context_frame(&local_187c,(lazy_ostream *)local_13b8)
  ;
  bVar2 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(&local_187c);
  if (bVar2) {
    local_1820 = picnic_signature_size(*parameters);
    local_1478.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1488.m_begin = "";
    local_1478.m_end = "";
    local_1488.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1478,0x72,&local_1488);
    local_1400[0].m_value = &local_1820;
    boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
              (&local_17a8,local_1400,false);
    local_1468 = "max_signature_size";
    local_1498.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_13b8[8] = false;
    local_1498.m_end = "";
    local_1460 = "";
    local_13b8._0_8_ = &PTR__lazy_ostream_001857a8;
    local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_13b8._24_8_ = (value_expr<bool> *)&local_1468;
    boost::test_tools::tt_detail::report_assertion
              (&local_17a8,(lazy_ostream *)local_13b8,&local_1498,0x72,CHECK,CHECK_BUILT_ASSERTION,0
              );
    boost::detail::shared_count::~shared_count(&local_17a8.m_message.pn);
    local_14a8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_14b8.m_begin = "";
    local_14a8.m_end = "";
    local_14b8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_14a8,0x76,&local_14b8);
    iVar3 = picnic_keygen(*parameters,local_1400,&local_1468);
    local_1878.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              (&local_17a8,(value_expr<bool> *)&local_1878,false);
    local_13b8._24_8_ = local_1810;
    local_1810[0]._0_8_ = "!picnic_keygen(parameters, &pk, &sk)";
    local_14c8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_13b8[8] = false;
    local_14c8.m_end = "";
    local_1810[0].m_message.px = (element_type *)0x167d40;
    local_13b8._0_8_ = &PTR__lazy_ostream_001857a8;
    local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    boost::test_tools::tt_detail::report_assertion
              (&local_17a8,(lazy_ostream *)local_13b8,&local_14c8,0x76,CHECK,CHECK_BUILT_ASSERTION,0
              );
    boost::detail::shared_count::~shared_count(&local_17a8.m_message.pn);
    local_17c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_17c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_17c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_17c8,local_1820);
    local_1810[0]._0_8_ = (param_type)0xff00000000;
    local_1828 = local_1820;
    std::random_device::random_device((random_device *)local_13b8);
    local_1818 = parameters;
    uVar4 = std::random_device::_M_getval();
    uVar7 = uVar4 / 0x7fffffff << 0x1f | uVar4 / 0x7fffffff;
    local_1878._0_8_ = ZEXT48(uVar7 + uVar4 + (uint)(uVar4 + uVar7 == 0));
    lVar8 = 0;
    do {
      rVar5 = std::uniform_int_distribution<unsigned_int>::operator()
                        ((uniform_int_distribution<unsigned_int> *)local_1810,
                         (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                         &local_1878,(param_type *)local_1810);
      (&local_17a8.p_predicate_value)[lVar8].super_readonly_property<bool>.
      super_class_property<bool>.value = SUB41(rVar5,0);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
    std::random_device::_M_fini();
    paVar1 = local_1818;
    local_14d8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_14e8.m_begin = "";
    local_14d8.m_end = "";
    local_14e8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_14d8,0x7f,&local_14e8);
    iVar3 = picnic_sign(&local_1468,&local_17a8,0x100,
                        local_17c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start,&local_1828);
    local_1898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = iVar3 == 0;
    boost::test_tools::assertion::value_expr<bool>::evaluate
              (local_1810,(value_expr<bool> *)&local_1898,false);
    local_1878._0_8_ =
         "!picnic_sign(&sk, message.data(), message.size(), signature.data(), &signature_len)";
    local_14f8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_13b8[8] = false;
    local_14f8.m_end = "";
    local_1878.m_message.px = (element_type *)0x167f8b;
    local_13b8._0_8_ = &PTR__lazy_ostream_001857a8;
    local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_13b8._24_8_ =
         (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_1878;
    boost::test_tools::tt_detail::report_assertion
              (local_1810,(lazy_ostream *)local_13b8,&local_14f8,0x7f,CHECK,CHECK_BUILT_ASSERTION,0)
    ;
    boost::detail::shared_count::~shared_count(&local_1810[0].m_message.pn);
    local_1508.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1518.m_begin = "";
    local_1508.m_end = "";
    local_1518.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1508,0x81,&local_1518);
    iVar3 = picnic_verify(local_1400,&local_17a8,0x100,
                          local_17c8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,local_1828);
    local_1898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_1898.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,iVar3 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              (local_1810,(value_expr<bool> *)&local_1898,false);
    local_1878._0_8_ =
         "!picnic_verify(&pk, message.data(), message.size(), signature.data(), signature_len)";
    local_1528.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_13b8[8] = false;
    local_1528.m_end = "";
    local_1878.m_message.px = (element_type *)0x167fe0;
    local_13b8._0_8_ = &PTR__lazy_ostream_001857a8;
    local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_13b8._24_8_ =
         (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_1878;
    boost::test_tools::tt_detail::report_assertion
              (local_1810,(lazy_ostream *)local_13b8,&local_1528,0x81,CHECK,CHECK_BUILT_ASSERTION,0)
    ;
    boost::detail::shared_count::~shared_count(&local_1810[0].m_message.pn);
    local_1898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar6 = picnic_get_public_key_size(*paVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_1898,sVar6);
    (anonymous_namespace)::
    randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&local_1898);
    local_1854 = picnic_write_public_key
                           (local_1400,
                            local_1898.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1898.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_1898.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
    local_1538.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1548.m_begin = "";
    local_1538.m_end = "";
    local_1548.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1538,0x88,&local_1548);
    local_1878.m_message.px = (element_type *)((ulong)local_1878.m_message.px & 0xffffffff00000000);
    local_1878._0_8_ = &local_1854;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_int,_boost::test_tools::assertion::op::GT<int,_int,_void>_>
    ::evaluate(local_1810,
               (binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_int,_boost::test_tools::assertion::op::GT<int,_int,_void>_>
                *)&local_1878,false);
    local_1850._0_8_ = "pk_written > 0";
    local_1558.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_13b8[8] = false;
    local_1558.m_end = "";
    local_1850.m_message.px = (element_type *)0x167fef;
    local_13b8._0_8_ = &PTR__lazy_ostream_001857a8;
    local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_13b8._24_8_ = &local_1850;
    boost::test_tools::tt_detail::report_assertion
              (local_1810,(lazy_ostream *)local_13b8,&local_1558,0x88,CHECK,CHECK_BUILT_ASSERTION,0)
    ;
    boost::detail::shared_count::~shared_count(&local_1810[0].m_message.pn);
    local_1568.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1578.m_begin = "";
    local_1568.m_end = "";
    local_1578.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1568,0x89,&local_1578);
    local_1878.m_message.px =
         (element_type *)
         (local_1898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish +
         -(long)local_1898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start);
    local_1878._0_8_ = &local_1854;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_unsigned_long,_boost::test_tools::assertion::op::LE<int,_unsigned_long,_void>_>
    ::evaluate(local_1810,
               (binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_unsigned_long,_boost::test_tools::assertion::op::LE<int,_unsigned_long,_void>_>
                *)&local_1878,false);
    local_1850._0_8_ = "pk_written <= buf.size()";
    local_1588.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_13b8[8] = false;
    local_1588.m_end = "";
    local_1850.m_message.px = (element_type *)0x168008;
    local_13b8._0_8_ = &PTR__lazy_ostream_001857a8;
    local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_13b8._24_8_ = &local_1850;
    boost::test_tools::tt_detail::report_assertion
              (local_1810,(lazy_ostream *)local_13b8,&local_1588,0x89,CHECK,CHECK_BUILT_ASSERTION,0)
    ;
    boost::detail::shared_count::~shared_count(&local_1810[0].m_message.pn);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_1898,(long)local_1854)
    ;
    local_1598.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_15a8.m_begin = "";
    local_1598.m_end = "";
    local_15a8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1598,0x8d,&local_15a8);
    iVar3 = picnic_read_public_key
                      (local_1810,
                       local_1898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)local_1898.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1898.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    local_1838._0_1_ = iVar3 == 0;
    boost::test_tools::assertion::value_expr<bool>::evaluate
              (&local_1878,(value_expr<bool> *)&local_1838,false);
    local_1850._0_8_ = "!picnic_read_public_key(&pk2, buf.data(), buf.size())";
    local_15b8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_13b8[8] = false;
    local_15b8.m_end = "";
    local_1850.m_message.px = (element_type *)0x16803e;
    local_13b8._0_8_ = &PTR__lazy_ostream_001857a8;
    local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_13b8._24_8_ = &local_1850;
    boost::test_tools::tt_detail::report_assertion
              (&local_1878,(lazy_ostream *)local_13b8,&local_15b8,0x8d,CHECK,CHECK_BUILT_ASSERTION,0
              );
    boost::detail::shared_count::~shared_count(&local_1878.m_message.pn);
    local_15c8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_15d8.m_begin = "";
    local_15c8.m_end = "";
    local_15d8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_15c8,0x8f,&local_15d8);
    iVar3 = picnic_verify(local_1810,&local_17a8,0x100,
                          local_17c8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,local_1828);
    local_1838 = (char *)CONCAT71(local_1838._1_7_,iVar3 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              (&local_1878,(value_expr<bool> *)&local_1838,false);
    local_1850._0_8_ =
         "!picnic_verify(&pk2, message.data(), message.size(), signature.data(), signature_len)";
    local_15e8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_13b8[8] = false;
    local_15e8.m_end = "";
    local_1850.m_message.px = (element_type *)0x168094;
    local_13b8._0_8_ = &PTR__lazy_ostream_001857a8;
    local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_13b8._24_8_ = &local_1850;
    boost::test_tools::tt_detail::report_assertion
              (&local_1878,(lazy_ostream *)local_13b8,&local_15e8,0x8f,CHECK,CHECK_BUILT_ASSERTION,0
              );
    boost::detail::shared_count::~shared_count(&local_1878.m_message.pn);
    sVar6 = picnic_get_private_key_size(*local_1818);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_1898,sVar6);
    (anonymous_namespace)::
    randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&local_1898);
    local_1858 = picnic_write_private_key
                           (&local_1468,
                            local_1898.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1898.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_1898.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
    local_15f8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1608.m_begin = "";
    local_15f8.m_end = "";
    local_1608.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_15f8,0x94,&local_1608);
    local_1850.m_message.px = (element_type *)((ulong)local_1850.m_message.px & 0xffffffff00000000);
    local_1850._0_8_ = &local_1858;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_int,_boost::test_tools::assertion::op::GT<int,_int,_void>_>
    ::evaluate(&local_1878,
               (binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_int,_boost::test_tools::assertion::op::GT<int,_int,_void>_>
                *)&local_1850,false);
    local_1838 = "sk_written > 0";
    local_13b8[8] = false;
    local_1618.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1618.m_end = "";
    local_1830 = "";
    local_13b8._0_8_ = &PTR__lazy_ostream_001857a8;
    local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_13b8._24_8_ = (value_expr<bool> *)&local_1838;
    boost::test_tools::tt_detail::report_assertion
              (&local_1878,(lazy_ostream *)local_13b8,&local_1618,0x94,CHECK,CHECK_BUILT_ASSERTION,0
              );
    boost::detail::shared_count::~shared_count(&local_1878.m_message.pn);
    local_1628.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1638.m_begin = "";
    local_1628.m_end = "";
    local_1638.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1628,0x95,&local_1638);
    local_1850.m_message.px =
         (element_type *)
         (local_1898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish +
         -(long)local_1898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start);
    local_1850._0_8_ = &local_1858;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_unsigned_long,_boost::test_tools::assertion::op::LE<int,_unsigned_long,_void>_>
    ::evaluate(&local_1878,
               (binary_expr<boost::test_tools::assertion::value_expr<const_int_&>,_unsigned_long,_boost::test_tools::assertion::op::LE<int,_unsigned_long,_void>_>
                *)&local_1850,false);
    local_1838 = "sk_written <= buf.size()";
    local_13b8[8] = false;
    local_1648.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1648.m_end = "";
    local_1830 = "";
    local_13b8._0_8_ = &PTR__lazy_ostream_001857a8;
    local_13b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_13b8._24_8_ = (value_expr<bool> *)&local_1838;
    boost::test_tools::tt_detail::report_assertion
              (&local_1878,(lazy_ostream *)local_13b8,&local_1648,0x95,CHECK,CHECK_BUILT_ASSERTION,0
              );
    boost::detail::shared_count::~shared_count(&local_1878.m_message.pn);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_1898,(long)local_1858)
    ;
    local_1658.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1668.m_begin = "";
    local_1658.m_end = "";
    local_1668.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1658,0x99,&local_1668);
    iVar3 = picnic_read_private_key
                      (local_13b8,
                       local_1898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)local_1898.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1898.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    local_1899.m_value = iVar3 == 0;
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_1850,&local_1899,false);
    local_1838 = "!picnic_read_private_key(&sk2, buf.data(), buf.size())";
    local_1678.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1878.m_message.px = (element_type *)((ulong)local_1878.m_message.px & 0xffffffffffffff00);
    local_1678.m_end = "";
    local_1830 = "";
    local_1878._0_8_ = &PTR__lazy_ostream_001857a8;
    local_1878.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1860 = (value_expr<bool> *)&local_1838;
    boost::test_tools::tt_detail::report_assertion
              (&local_1850,(lazy_ostream *)&local_1878,&local_1678,0x99,CHECK,CHECK_BUILT_ASSERTION,
               0);
    boost::detail::shared_count::~shared_count(&local_1850.m_message.pn);
    local_1688.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1698.m_begin = "";
    local_1688.m_end = "";
    local_1698.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1688,0x9a,&local_1698);
    iVar3 = picnic_validate_keypair(local_13b8,local_1810);
    local_1899.m_value = iVar3 == 0;
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_1850,&local_1899,false);
    local_1838 = "!picnic_validate_keypair(&sk2, &pk2)";
    local_16a8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1878.m_message.px = (element_type *)((ulong)local_1878.m_message.px & 0xffffffffffffff00);
    local_16a8.m_end = "";
    local_1830 = "";
    local_1878._0_8_ = &PTR__lazy_ostream_001857a8;
    local_1878.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1860 = (value_expr<bool> *)&local_1838;
    boost::test_tools::tt_detail::report_assertion
              (&local_1850,(lazy_ostream *)&local_1878,&local_16a8,0x9a,CHECK,CHECK_BUILT_ASSERTION,
               0);
    boost::detail::shared_count::~shared_count(&local_1850.m_message.pn);
    if (local_1898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1898.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_17c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_17c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  boost::test_tools::tt_detail::context_frame::~context_frame(&local_187c);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(read_write, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature;
    signature.resize(max_signature_size);
    size_t signature_len = max_signature_size;

    std::array<uint8_t, 256> message;
    randomize_container(message);

    BOOST_TEST(!picnic_sign(&sk, message.data(), message.size(), signature.data(), &signature_len));
    BOOST_TEST(
        !picnic_verify(&pk, message.data(), message.size(), signature.data(), signature_len));

    std::vector<uint8_t> buf;
    buf.resize(picnic_get_public_key_size(parameters));
    randomize_container(buf);

    const auto pk_written = picnic_write_public_key(&pk, buf.data(), buf.size());
    BOOST_TEST(pk_written > 0);
    BOOST_TEST(pk_written <= buf.size());
    buf.resize(pk_written);

    picnic_publickey_t pk2;
    BOOST_TEST(!picnic_read_public_key(&pk2, buf.data(), buf.size()));
    BOOST_TEST(
        !picnic_verify(&pk2, message.data(), message.size(), signature.data(), signature_len));

    buf.resize(picnic_get_private_key_size(parameters));
    randomize_container(buf);
    const auto sk_written = picnic_write_private_key(&sk, buf.data(), buf.size());
    BOOST_TEST(sk_written > 0);
    BOOST_TEST(sk_written <= buf.size());
    buf.resize(sk_written);

    picnic_privatekey_t sk2;
    BOOST_TEST(!picnic_read_private_key(&sk2, buf.data(), buf.size()));
    BOOST_TEST(!picnic_validate_keypair(&sk2, &pk2));
  }
}